

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader.hpp
# Opt level: O2

uint8_t __thiscall duckdb::BitReader::InnerRead(BitReader *this,uint8_t *size,uint8_t *offset)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  
  bVar1 = *size;
  uVar2 = this->index;
  uVar3 = uVar2 & 7;
  return (REMAINDER_MASKS[(ulong)uVar3 + (ulong)bVar1] &
         this->input[((ulong)*offset + (ulong)(uVar2 >> 3) + 1) - (ulong)(uVar3 + bVar1 < 8)]) >>
         (-((char)uVar2 + bVar1) & 7) |
         (byte)(((uint)(byte)MASKS[bVar1] &
                (uint)this->input[(ulong)*offset + (ulong)(uVar2 >> 3)] << (sbyte)uVar3) >>
               (8 - bVar1 & 0x1f));
}

Assistant:

inline uint8_t InnerRead(const uint8_t &size, const uint8_t &offset) {
		const uint8_t right_shift = 8 - size;
		const uint8_t bit_remainder = (8 - ((size + BitIndex()) - 8)) & 7;
		// The least significant bits are positioned at the far right of the byte

		// Create a mask given the size and index
		// Take the first byte
		// Left-shift it by index, to line up the bits we're interested in with the mask
		// Get the mask for the given size
		// Bit-wise AND the byte and the mask together
		// Right-shift this result (the most significant bits)

		// Sometimes we will need to read from the second byte
		// But to make this branchless, we will perform what is basically a no-op if this condition is not true
		// SPILL = (index + size >= 8)
		//
		// If SPILL is true:
		// The REMAINDER_MASKS gives us the mask for the bits we're interested in
		// We bit-wise AND these together (no need to shift anything because the index is essentially zero for this new
		// byte) And we then right-shift these bits in place (to the right of the previous bits)
		const bool spill_to_next_byte = (size + BitIndex() >= 8);
		uint8_t result =
		    ((input[ByteIndex() + offset] << BitIndex()) & MASKS[size]) >> right_shift |
		    ((input[ByteIndex() + offset + spill_to_next_byte] & REMAINDER_MASKS[size + BitIndex()]) >> bit_remainder);
		return result;
	}